

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

void skiwi::anon_unknown_1::show_memory(context *ctxt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_80;
  long local_78;
  size_t heap_size_before_gc;
  long local_68;
  size_t heap_size_available_until_overflow;
  long local_58;
  size_t heap_size_used;
  double local_48;
  unsigned_long local_40;
  uint64_t *local_38;
  uint64_t *ptr;
  uint64_t uStack_28;
  uint32_t nr_of_globals_used;
  size_t heap_size;
  size_t nr_locals;
  size_t nr_globals;
  context *ctxt_local;
  
  nr_locals = (long)ctxt->globals_end - (long)ctxt->globals >> 3;
  heap_size = ctxt->number_of_locals;
  uStack_28 = ctxt->total_heap_size;
  ptr._4_4_ = 0;
  for (local_38 = ctxt->globals; local_38 != ctxt->globals_end; local_38 = local_38 + 1) {
    if (*local_38 != 0x3f) {
      ptr._4_4_ = ptr._4_4_ + 1;
    }
  }
  nr_globals = (size_t)ctxt;
  (anonymous_namespace)::out<char_const(&)[37],unsigned_long&,char_const(&)[2]>
            ((char (*) [37])"maximum number of global variables: ",&nr_locals,(char (*) [2])0x4e6c28
            );
  (anonymous_namespace)::out<char_const(&)[38],unsigned_int&,char_const(&)[2]>
            ((char (*) [38])"number of global variables assigned: ",(uint *)((long)&ptr + 4),
             (char (*) [2])0x4e6c28);
  local_40 = heap_size + 8;
  (anonymous_namespace)::out<char_const(&)[36],unsigned_long,char_const(&)[2]>
            ((char (*) [36])"maximum number of local variables: ",&local_40,(char (*) [2])0x4e6c28);
  auVar2._8_4_ = (int)(uStack_28 >> 0x20);
  auVar2._0_8_ = uStack_28;
  auVar2._12_4_ = 0x45300000;
  local_48 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uStack_28) - 4503599627370496.0)) / 125000.0;
  (anonymous_namespace)::out<char_const(&)[12],double,char_const(&)[4]>
            ((char (*) [12])"heap size: ",&local_48,(char (*) [4])"Mb\n");
  auVar3._8_4_ = (int)(uStack_28 >> 0x20);
  auVar3._0_8_ = uStack_28;
  auVar3._12_4_ = 0x45300000;
  heap_size_used =
       (size_t)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uStack_28) - 4503599627370496.0)) / 250000.0);
  (anonymous_namespace)::out<char_const(&)[22],double,char_const(&)[4]>
            ((char (*) [22])"heap semispace size: ",(double *)&heap_size_used,(char (*) [4])"Mb\n");
  lVar1 = *(long *)(nr_globals + 0x48) - *(long *)(nr_globals + 0x58);
  local_58 = lVar1 >> 3;
  auVar4._8_4_ = (int)(lVar1 >> 0x23);
  auVar4._0_8_ = local_58;
  auVar4._12_4_ = 0x45300000;
  heap_size_available_until_overflow =
       (size_t)(((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) / 125000.0);
  (anonymous_namespace)::out<char_const(&)[17],double,char_const(&)[4]>
            ((char (*) [17])"heap size used: ",(double *)&heap_size_available_until_overflow,
             (char (*) [4])"Mb\n");
  if (*(ulong *)(nr_globals + 0x48) < *(ulong *)(nr_globals + 0x60)) {
    lVar1 = *(long *)(nr_globals + 0x60) - *(long *)(nr_globals + 0x48);
    local_68 = lVar1 >> 3;
    auVar5._8_4_ = (int)(lVar1 >> 0x23);
    auVar5._0_8_ = local_68;
    auVar5._12_4_ = 0x45300000;
    heap_size_before_gc =
         (size_t)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) / 125000.0);
    (anonymous_namespace)::out<char_const(&)[32],double,char_const(&)[4]>
              ((char (*) [32])"heap available until overflow: ",(double *)&heap_size_before_gc,
               (char (*) [4])"Mb\n");
  }
  else {
    (anonymous_namespace)::out<char_const(&)[33]>
              ((char (*) [33])"current status is heap overflow\n");
  }
  if (*(ulong *)(nr_globals + 0x48) < *(ulong *)(nr_globals + 0x50)) {
    lVar1 = *(long *)(nr_globals + 0x50) - *(long *)(nr_globals + 0x48);
    local_78 = lVar1 >> 3;
    auVar6._8_4_ = (int)(lVar1 >> 0x23);
    auVar6._0_8_ = local_78;
    auVar6._12_4_ = 0x45300000;
    local_80 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) / 125000.0;
    (anonymous_namespace)::out<char_const(&)[56],double,char_const(&)[4]>
              ((char (*) [56])"heap size allocable before garbage collection trigger: ",&local_80,
               (char (*) [4])"Mb\n");
  }
  else {
    (anonymous_namespace)::out<char_const(&)[50]>
              ((char (*) [50])"garbage collection will be triggered immediately\n");
  }
  return;
}

Assistant:

void show_memory(const context& ctxt)
    {
    size_t nr_globals = ctxt.globals_end - ctxt.globals;
    size_t nr_locals = ctxt.number_of_locals;
    size_t heap_size = ctxt.total_heap_size;
    uint32_t nr_of_globals_used = 0;
    uint64_t* ptr = ctxt.globals;
    while (ptr != ctxt.globals_end)
      {
      if (*ptr != unalloc_tag)
        ++nr_of_globals_used;
      ++ptr;
      }
    out("maximum number of global variables: ", nr_globals, "\n");
    out("number of global variables assigned: ", nr_of_globals_used, "\n");
    out("maximum number of local variables: ", nr_locals + 8, "\n");
    out("heap size: ", (double)heap_size / (0.125 * 1000.0 * 1000.0), "Mb\n");
    out("heap semispace size: ", (double)heap_size / (2.0 * 0.125 * 1000.0 * 1000.0), "Mb\n");

    size_t heap_size_used = ctxt.alloc - ctxt.from_space;
    out("heap size used: ", (double)heap_size_used / (0.125 * 1000.0 * 1000.0), "Mb\n");

    if (ctxt.alloc < ctxt.from_space_end)
      {
      size_t heap_size_available_until_overflow = ctxt.from_space_end - ctxt.alloc;
      out("heap available until overflow: ", (double)heap_size_available_until_overflow / (0.125 * 1000.0 * 1000.0), "Mb\n");
      }
    else
      {
      out("current status is heap overflow\n");
      }
    if (ctxt.alloc < ctxt.limit)
      {
      size_t heap_size_before_gc = ctxt.limit - ctxt.alloc;
      out("heap size allocable before garbage collection trigger: ", (double)heap_size_before_gc / (0.125 * 1000.0 * 1000.0), "Mb\n");
      }
    else
      {
      out("garbage collection will be triggered immediately\n");
      }
    }